

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

lysp_node ** lysp_node_child_p(lysp_node *node)

{
  ushort uVar1;
  lysp_node **pplVar2;
  
  if (node == (lysp_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                  ,0x5d4,"struct lysp_node **lysp_node_child_p(struct lysp_node *)");
  }
  uVar1 = node->nodetype;
  pplVar2 = (lysp_node **)0x0;
  if (0x3ff < uVar1) {
    if (uVar1 < 0x2000) {
      if ((uVar1 != 0x400) && (uVar1 != 0x1000)) {
        return pplVar2;
      }
    }
    else if (uVar1 != 0x2000) {
      if (uVar1 == 0x4000) {
        return &node[1].next;
      }
      if (uVar1 != 0x8000) {
        return pplVar2;
      }
      goto LAB_001648cf;
    }
    return (lysp_node **)&node[1].name;
  }
  if (uVar1 < 0x10) {
    if (uVar1 == 1) {
LAB_001648eb:
      return (lysp_node **)&node[1].ref;
    }
    if (uVar1 != 2) {
      return pplVar2;
    }
  }
  else {
    if (uVar1 == 0x10) goto LAB_001648eb;
    if (uVar1 != 0x80) {
      return pplVar2;
    }
  }
LAB_001648cf:
  return &node[1].parent;
}

Assistant:

struct lysp_node **
lysp_node_child_p(struct lysp_node *node)
{
    assert(node);
    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->child;
    case LYS_CHOICE:
        return &((struct lysp_node_choice *)node)->child;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->child;
    case LYS_CASE:
        return &((struct lysp_node_case *)node)->child;
    case LYS_GROUPING:
        return &((struct lysp_node_grp *)node)->child;
    case LYS_AUGMENT:
        return &((struct lysp_node_augment *)node)->child;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysp_node_action_inout *)node)->child;
    case LYS_NOTIF:
        return &((struct lysp_node_notif *)node)->child;
    default:
        return NULL;
    }
}